

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_desc_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  string *psVar1;
  Option *opt_local;
  Formatter *this_local;
  
  psVar1 = Option::get_description_abi_cxx11_(opt);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_desc(const Option *opt) const { return opt->get_description(); }